

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

PathTypeHandlerBase * __thiscall
Js::SimpleTypeHandler<3UL>::ConvertToPathType(SimpleTypeHandler<3UL> *this,DynamicObject *instance)

{
  code *pcVar1;
  ushort slotIndex;
  bool bVar2;
  BYTE values;
  PropertyTypes values_00;
  uint16 uVar3;
  uint16 offsetOfInlineSlots;
  int iVar4;
  TypeId typeId;
  BOOL BVar5;
  ScriptContext *pSVar6;
  JavascriptLibrary *this_00;
  TypePath *typePath;
  undefined4 *puVar7;
  RecyclableObject *prototype;
  PropertyRecord *this_01;
  DynamicTypeHandler *pDVar8;
  DynamicType *pDVar9;
  PathTypeHandlerBase *pPVar10;
  Recycler *this_02;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  bool local_c1;
  bool local_a9;
  bool local_99;
  PathTypeSuccessorKey local_78;
  PathTypeHandlerBase *local_70;
  PathTypeHandlerBase *predTypeHandler;
  Var pvStack_60;
  bool markAsFixed;
  Var value;
  PropertyIndex local_4a;
  ushort local_48;
  ObjectSlotAttributes local_45;
  PropertyId PStack_44;
  PropertyIndex index;
  PropertyIndex i;
  ObjectSlotAttributes attr;
  PropertyId propertyId;
  DynamicType *currentType;
  DynamicType *existingType;
  PathTypeHandlerBase *pPStack_28;
  bool allowFixedFields;
  PathTypeHandlerBase *newTypeHandler;
  ScriptContext *scriptContext;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  scriptContext = (ScriptContext *)instance;
  instance_local = (DynamicObject *)this;
  pSVar6 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  newTypeHandler = (PathTypeHandlerBase *)pSVar6;
  this_00 = ScriptContext::GetLibrary(pSVar6);
  typePath = JavascriptLibrary::GetRootPath(this_00);
  iVar4 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  uVar3 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots(&this->super_DynamicTypeHandler);
  pPStack_28 = &PathTypeHandlerNoAttr::New
                          (pSVar6,typePath,0,(PropertyIndex)iVar4,uVar3,offsetOfInlineSlots,true,
                           false,(DynamicType *)0x0)->super_PathTypeHandlerBase;
  DynamicTypeHandler::SetMayBecomeShared(&pPStack_28->super_DynamicTypeHandler);
  bVar2 = HasSingletonInstanceOnlyIfNeeded(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0xc1,"(HasSingletonInstanceOnlyIfNeeded())",
                                "HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = DynamicTypeHandler::AreSingletonInstancesNeeded();
  local_99 = false;
  if (bVar2) {
    local_99 = DynamicObject::HasLockedType((DynamicObject *)scriptContext);
  }
  existingType._7_1_ = local_99;
  currentType = DynamicObject::GetDynamicType((DynamicObject *)scriptContext);
  pPVar10 = newTypeHandler;
  typeId = Js::Type::GetTypeId(&currentType->super_Type);
  prototype = Js::Type::GetPrototype(&currentType->super_Type);
  _i = DynamicType::New((ScriptContext *)pPVar10,typeId,prototype,(JavascriptMethod)0x0,
                        &pPStack_28->super_DynamicTypeHandler,false,false);
  PStack_44 = -1;
  local_45 = ObjectSlotAttr_None;
  for (local_48 = 0; (int)(uint)local_48 < this->propertyCount; local_48 = local_48 + 1) {
    this_01 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[local_48].Id);
    PStack_44 = PropertyRecord::GetPropertyId(this_01);
    local_45 = PathTypeHandlerBase::PropertyAttributesToObjectSlotAttributes
                         (this->descriptors[local_48].field_1.Attributes);
    pPVar10 = pPStack_28;
    pDVar9 = _i;
    PathTypeSuccessorKey::PathTypeSuccessorKey
              ((PathTypeSuccessorKey *)((long)&value + 4),PStack_44,local_45);
    _i = PathTypeHandlerBase::PromoteType<false>
                   (pPVar10,pDVar9,stack0xffffffffffffffac,false,(ScriptContext *)newTypeHandler,
                    (DynamicObject *)scriptContext,&local_4a);
    pDVar8 = DynamicType::GetTypeHandler(_i);
    pPStack_28 = PathTypeHandlerBase::FromTypeHandler(pDVar8);
    pvStack_60 = DynamicObject::GetSlot((DynamicObject *)scriptContext,(uint)local_48);
    local_a9 = false;
    if ((existingType._7_1_ & 1) != 0) {
      BVar5 = IsInternalPropertyId(PStack_44);
      local_a9 = false;
      if ((BVar5 == 0) && (local_a9 = false, pvStack_60 != (Var)0x0)) {
        bVar2 = VarIs<Js::JavascriptFunction>(pvStack_60);
        if (bVar2) {
          local_c1 = DynamicTypeHandler::ShouldFixMethodProperties();
        }
        else {
          local_c1 = false;
        }
        local_a9 = local_c1;
      }
    }
    pSVar6 = scriptContext;
    pPVar10 = pPStack_28;
    slotIndex = local_48;
    predTypeHandler._7_1_ = local_a9;
    uVar3 = PathTypeHandlerBase::GetPathLength(pPStack_28);
    predTypeHandler._6_1_ = (bool)(predTypeHandler._7_1_ & 1);
    PathTypeHandlerBase::
    InitializePath<Js::SimpleTypeHandler<3ul>::ConvertToPathType(Js::DynamicObject*)::_lambda()_1_>
              (pPVar10,(DynamicObject *)pSVar6,slotIndex,uVar3,(ScriptContext *)newTypeHandler,
               predTypeHandler._6_1_);
  }
  bVar2 = DynamicType::GetIsLocked(currentType);
  if (bVar2) {
    DynamicTypeHandler::LockTypeHandler(&pPStack_28->super_DynamicTypeHandler);
  }
  bVar2 = DynamicType::GetIsShared(currentType);
  if (bVar2) {
    DynamicTypeHandler::ShareTypeHandler
              (&pPStack_28->super_DynamicTypeHandler,(ScriptContext *)newTypeHandler);
  }
  pPVar10 = pPStack_28;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags(&pPVar10->super_DynamicTypeHandler,'\"',values);
  pPVar10 = pPStack_28;
  values_00 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&pPVar10->super_DynamicTypeHandler,0xb0,values_00);
  DynamicTypeHandler::SetInstanceTypeHandler
            (&pPStack_28->super_DynamicTypeHandler,(DynamicObject *)scriptContext,false);
  pDVar9 = PathTypeHandlerBase::GetPredecessorType(pPStack_28);
  if (pDVar9 != (DynamicType *)0x0) {
    pDVar9 = PathTypeHandlerBase::GetPredecessorType(pPStack_28);
    pDVar8 = DynamicType::GetTypeHandler(pDVar9);
    pPVar10 = PathTypeHandlerBase::FromTypeHandler(pDVar8);
    local_70 = pPVar10;
    pDVar9 = PathTypeHandlerBase::GetPredecessorType(pPStack_28);
    PathTypeSuccessorKey::PathTypeSuccessorKey(&local_78,PStack_44,local_45);
    this_02 = ScriptContext::GetRecycler((ScriptContext *)newTypeHandler);
    typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(this_02,currentType);
    PathTypeHandlerBase::ReplaceSuccessor(pPVar10,pDVar9,local_78,typeWeakRef);
  }
  return pPStack_28;
}

Assistant:

PathTypeHandlerBase* SimpleTypeHandler<size>::ConvertToPathType(DynamicObject* instance)
    {
        ScriptContext *scriptContext = instance->GetScriptContext();
        PathTypeHandlerBase* newTypeHandler =
            PathTypeHandlerNoAttr::New(
                scriptContext,
                scriptContext->GetLibrary()->GetRootPath(),
                0,
                static_cast<PropertyIndex>(this->GetSlotCapacity()),
                this->GetInlineSlotCapacity(),
                this->GetOffsetOfInlineSlots(),
                true,
                false);
        newTypeHandler->SetMayBecomeShared();

#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        Assert(HasSingletonInstanceOnlyIfNeeded());

        // If instance has a shared type, the type handler change below will induce a type transition, which
        // guarantees that any existing fast path field stores (which could quietly overwrite a fixed field
        // on this instance) will be invalidated.  It is safe to mark all fields as fixed.
        bool const allowFixedFields = DynamicTypeHandler::AreSingletonInstancesNeeded() && instance->HasLockedType();
#endif
#endif

        DynamicType *existingType = instance->GetDynamicType();
        DynamicType *currentType = DynamicType::New(scriptContext, existingType->GetTypeId(), existingType->GetPrototype(), nullptr, newTypeHandler, false, false);
        PropertyId propertyId = Constants::NoProperty;
        ObjectSlotAttributes attr = ObjectSlotAttr_None;
        for (PropertyIndex i = 0; i < propertyCount; i++)
        {
            propertyId = descriptors[i].Id->GetPropertyId();
            attr = PathTypeHandlerBase::PropertyAttributesToObjectSlotAttributes(descriptors[i].Attributes);
            PropertyIndex index;
            currentType = newTypeHandler->PromoteType<false>(currentType, PathTypeSuccessorKey(propertyId, attr), false, scriptContext, instance, &index);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(currentType->GetTypeHandler());
#if ENABLE_FIXED_FIELDS
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            Var value = instance->GetSlot(i);
            bool markAsFixed = allowFixedFields && !IsInternalPropertyId(propertyId) && value != nullptr &&
                (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : false);
            newTypeHandler->InitializePath(instance, i, newTypeHandler->GetPathLength(), scriptContext, [=]() { return markAsFixed; });
#endif
#endif
        }

        if (existingType->GetIsLocked())
        {
            newTypeHandler->LockTypeHandler();
        }
        if (existingType->GetIsShared())
        {
            newTypeHandler->ShareTypeHandler(scriptContext);
        }
        newTypeHandler->SetFlags(IsPrototypeFlag | HasKnownSlot0Flag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance, false);
        if (newTypeHandler->GetPredecessorType())
        {
            PathTypeHandlerBase *predTypeHandler = PathTypeHandlerBase::FromTypeHandler(newTypeHandler->GetPredecessorType()->GetTypeHandler());
            predTypeHandler->ReplaceSuccessor(newTypeHandler->GetPredecessorType(), PathTypeSuccessorKey(propertyId, attr), scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicType>(existingType));
        }

        return newTypeHandler;
    }